

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsnav.c
# Opt level: O2

char fsnav_step(void)

{
  size_t sVar1;
  fsnav_plugin *pfVar2;
  fsnav_struct *pfVar3;
  int iVar4;
  ulong uVar5;
  int iVar6;
  bool bVar7;
  
  pfVar3 = fsnav;
  (fsnav->core).current_plugin_id = 0;
  uVar5 = 0;
  do {
    if ((pfVar3->core).plugin_count <= uVar5) {
LAB_00106fde:
      if (pfVar3->mode == 0) {
        pfVar3->mode = 1;
        bVar7 = true;
      }
      else {
        bVar7 = true;
        if (pfVar3->mode < 0) {
          bVar7 = (pfVar3->core).exit_plugin_id < 0xffffffff;
        }
      }
      return bVar7;
    }
    pfVar2 = (pfVar3->core).plugins;
    if (pfVar3->mode < 1) {
LAB_00106f47:
      (*pfVar2[uVar5].func)();
      pfVar2 = (fsnav->core).plugins;
      iVar4 = pfVar2[uVar5].cycle;
      pfVar3 = fsnav;
    }
    else {
      iVar4 = pfVar2[uVar5].cycle;
      if ((0 < iVar4) && (pfVar2[uVar5].tick == pfVar2[uVar5].shift)) goto LAB_00106f47;
    }
    iVar6 = pfVar2[uVar5].tick + 1;
    pfVar2[uVar5].tick = iVar6;
    if (iVar4 <= iVar6) {
      pfVar2[uVar5].tick = 0;
    }
    sVar1 = (pfVar3->core).exit_plugin_id;
    if (sVar1 == uVar5) {
      (pfVar3->core).exit_plugin_id = 0xffffffff;
      (pfVar3->core).host_termination = '\0';
      fsnav_free();
      pfVar3 = fsnav;
      goto LAB_00106fde;
    }
    if (pfVar3->mode < 0) {
      if (sVar1 == 0xffffffff) goto LAB_00106fb1;
    }
    else if ((sVar1 == 0xffffffff && (pfVar3->core).host_termination == '\x01') && pfVar3->mode != 0
            ) {
      pfVar3->mode = -1;
LAB_00106fb1:
      (pfVar3->core).exit_plugin_id = uVar5;
    }
    uVar5 = (pfVar3->core).current_plugin_id + 1;
    (pfVar3->core).current_plugin_id = uVar5;
  } while( true );
}

Assistant:

char fsnav_step(void)
{
	size_t i;

	// loop through plugin execution list
	for (fsnav->core.current_plugin_id = 0; fsnav->core.current_plugin_id < fsnav->core.plugin_count; fsnav->core.current_plugin_id++) {
		i = fsnav->core.current_plugin_id;

		if (fsnav->mode <= 0                                                                                    // init/termination mode
			|| (fsnav->core.plugins[i].cycle > 0 && fsnav->core.plugins[i].tick == fsnav->core.plugins[i].shift)) // or the scheduled tick has come
			fsnav->core.plugins[i].func();                                                                      // execute the current plugin

		fsnav->core.plugins[i].tick++;                                  // current tick increment
		if (fsnav->core.plugins[i].tick >= fsnav->core.plugins[i].cycle) // check to stay within the cycle
			fsnav->core.plugins[i].tick = 0;                            // reset tick

		if (fsnav->core.exit_plugin_id == i)	{     // if termination was initiated by the current plugin on the previous loop
			fsnav->core.exit_plugin_id = UINT_MAX; // set to default
			fsnav->core.host_termination = 0;      // set to default
			fsnav_free();                          // free memory
			break;
		}

		if ((fsnav->mode < 0 || fsnav->core.host_termination == 1) && fsnav->core.exit_plugin_id == UINT_MAX) { // if termination was initiated by the current plugin on the current loop
			if (fsnav->mode > 0)
				fsnav->mode = -1;               // set mode to -1 for external termination cases

			if (fsnav->mode != 0)
				fsnav->core.exit_plugin_id = i; // set the index to use in the next loop
		}
	}

	if (fsnav->mode == 0) // if initialization ended
		fsnav->mode = 1;  // set operation mode to regular operation

	// success if either staying in regular operation mode, or a termination properly detected
	return (fsnav->mode >= 0) || (fsnav->core.exit_plugin_id < UINT_MAX);
}